

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int x509_get_uid(uchar **p,uchar *end,mbedtls_x509_buf *uid,int n)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  if (*p != end) {
    uid->tag = (uint)**p;
    iVar2 = mbedtls_asn1_get_tag(p,end,&uid->len,n | 0xa0);
    iVar3 = 0;
    if ((iVar2 != -0x62) && (iVar3 = iVar2, iVar2 == 0)) {
      puVar1 = *p;
      uid->p = puVar1;
      *p = puVar1 + uid->len;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int x509_get_uid( unsigned char **p,
                         const unsigned char *end,
                         mbedtls_x509_buf *uid, int n )
{
    int ret;

    if( *p == end )
        return( 0 );

    uid->tag = **p;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &uid->len,
            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | n ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
            return( 0 );

        return( ret );
    }

    uid->p = *p;
    *p += uid->len;

    return( 0 );
}